

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::removeTarget(CommonCore *this,InterfaceHandle handle,string_view targetToRemove)

{
  string_view name;
  string_view message;
  size_t sVar1;
  FederateState *this_00;
  ActionMessage *pAVar2;
  char *in_RDI;
  FederateState *fed;
  ActionMessage cmd;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *handleInfo;
  CommonCore *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  InterfaceHandle in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  LocalFederateId federateID;
  ActionMessage local_f8;
  GlobalHandle *local_28;
  
  federateID.fid = (BaseType)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  local_28 = (GlobalHandle *)getHandleInfo(in_stack_fffffffffffffe88,in_stack_fffffffffffffe94);
  if (local_28 == (GlobalHandle *)0x0) {
    sVar1 = __cxa_allocate_exception(0x28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    message._M_str = in_RDI;
    message._M_len = sVar1;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffea0,message);
    __cxa_throw(sVar1,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  pAVar2 = &local_f8;
  ActionMessage::ActionMessage(pAVar2);
  ActionMessage::setSource(pAVar2,*local_28);
  name._M_str._0_4_ = in_stack_fffffffffffffe90;
  name._M_len = (size_t)in_stack_fffffffffffffe88;
  name._M_str._4_4_ = in_stack_fffffffffffffe94.hid;
  ActionMessage::name((ActionMessage *)0x551ccc,name);
  this_00 = getFederateAt((CommonCore *)CONCAT44(local_28[1].fed_id.gid,in_stack_fffffffffffffec8),
                          federateID);
  if (this_00 != (FederateState *)0x0) {
    local_f8.actionTime = FederateState::grantedTime(this_00);
    in_stack_fffffffffffffe90 = (undefined4)local_f8.actionTime.internalTimeCode;
    in_stack_fffffffffffffe94.hid = (BaseType)((ulong)local_f8.actionTime.internalTimeCode >> 0x20);
  }
  pAVar2 = (ActionMessage *)(ulong)(byte)((char)local_28[1].handle.hid + 0x9b);
  switch(pAVar2) {
  case (ActionMessage *)0x0:
    ActionMessage::setAction(&local_f8,cmd_remove_named_filter);
    break;
  case (ActionMessage *)0x1:
    ActionMessage::setAction(&local_f8,cmd_remove_named_endpoint);
    break;
  default:
    goto LAB_00551e14;
  case (ActionMessage *)0x4:
    ActionMessage::setAction(&local_f8,cmd_remove_named_publication);
    FederateState::addAction
              ((FederateState *)CONCAT44(in_stack_fffffffffffffe94.hid,in_stack_fffffffffffffe90),
               pAVar2);
    break;
  case (ActionMessage *)0xb:
    ActionMessage::setAction(&local_f8,cmd_remove_named_input);
  }
  BrokerBase::addActionMessage
            ((BrokerBase *)CONCAT44(in_stack_fffffffffffffe94.hid,in_stack_fffffffffffffe90),pAVar2)
  ;
LAB_00551e14:
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe94.hid,in_stack_fffffffffffffe90));
  return;
}

Assistant:

void CommonCore::removeTarget(InterfaceHandle handle, std::string_view targetToRemove)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }

    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.name(targetToRemove);
    auto* fed = getFederateAt(handleInfo->local_fed_id);
    if (fed != nullptr) {
        cmd.actionTime = fed->grantedTime();
    }
    switch (handleInfo->handleType) {
        case InterfaceType::PUBLICATION:
            cmd.setAction(CMD_REMOVE_NAMED_INPUT);
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_REMOVE_NAMED_ENDPOINT);
            break;
        case InterfaceType::INPUT:
            cmd.setAction(CMD_REMOVE_NAMED_PUBLICATION);
            fed->addAction(cmd);
            break;
        case InterfaceType::ENDPOINT:
            cmd.setAction(CMD_REMOVE_NAMED_FILTER);
            break;
        default:
            return;
    }
    addActionMessage(std::move(cmd));
}